

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O2

void __thiscall
qclab::qgates::Phase<std::complex<double>_>::Phase
          (Phase<std::complex<double>_> *this,int qubit,real_type theta,bool fixed)

{
  double dVar1;
  
  QGate1<std::complex<double>_>::QGate1(&this->super_QGate1<std::complex<double>_>,qubit);
  (this->super_QGate1<std::complex<double>_>).field_0xc = fixed;
  (this->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00136ba8;
  dVar1 = ::cos(theta);
  (this->angle_).cos_ = dVar1;
  dVar1 = ::sin(theta);
  (this->angle_).sin_ = dVar1;
  return;
}

Assistant:

Phase( const int qubit , const real_type theta ,
               const bool fixed = false )
        : QGate1< T >( qubit )
        , angle_( theta )
        , QAdjustable( fixed )
        { }